

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

char * getSelectionString(Atom selection)

{
  long lVar1;
  unsigned_long uVar2;
  int iVar3;
  Window WVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  size_t __size;
  Atom AVar8;
  bool bVar9;
  char *data;
  char *local_208;
  int actualFormat;
  Atom local_1f8;
  Atom local_1f0;
  unsigned_long itemCount;
  Atom actualType;
  long local_1d8;
  unsigned_long bytesAfter;
  Atom targets [2];
  XEvent notification;
  XEvent dummy;
  
  targets[0] = _glfw.x11.UTF8_STRING;
  targets[1] = 0x1f;
  bVar9 = _glfw.x11.PRIMARY != selection;
  local_1f8 = selection;
  WVar4 = XGetSelectionOwner(_glfw.x11.display);
  pcVar5 = *(char **)((long)_glfw.x11.keynames + (ulong)bVar9 * 8 + -0x10);
  if (WVar4 != _glfw.x11.helperWindowHandle) {
    lVar1 = (ulong)bVar9 * 8;
    free(pcVar5);
    *(undefined8 *)((long)_glfw.x11.keynames + lVar1 + -0x10) = 0;
    lVar7 = 0;
    AVar8 = local_1f8;
    while (lVar7 != 2) {
      local_1f0 = targets[lVar7];
      local_1d8 = lVar7;
      XConvertSelection(_glfw.x11.display,AVar8,local_1f0,_glfw.x11.GLFW_SELECTION,
                        _glfw.x11.helperWindowHandle,0);
      while (iVar3 = XCheckTypedWindowEvent
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,&notification),
            iVar3 == 0) {
        waitForX11Event((double *)0x0);
      }
      if (notification.xkey.time != 0) {
        XCheckIfEvent(_glfw.x11.display,&dummy,isSelPropNewValueNotify,&notification);
        XGetWindowProperty(_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                           0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,&bytesAfter,
                           &data);
        if (actualType == _glfw.x11.INCR) {
          __size = 1;
          local_208 = (char *)0x0;
          while( true ) {
            while (iVar3 = XCheckIfEvent(_glfw.x11.display,&dummy,isSelPropNewValueNotify,
                                         &notification), iVar3 == 0) {
              waitForX11Event((double *)0x0);
            }
            XFree(data);
            XGetWindowProperty(_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                               0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,
                               &bytesAfter,&data);
            uVar2 = itemCount;
            AVar8 = local_1f8;
            pcVar5 = local_208;
            if (itemCount == 0) break;
            __size = __size + itemCount;
            local_208 = (char *)realloc(local_208,__size);
            local_208[~uVar2 + __size] = '\0';
            strcat(local_208,data);
          }
          if (local_208 != (char *)0x0) {
            if (local_1f0 == 0x1f) {
              pcVar6 = convertLatin1toUTF8(local_208);
              *(char **)((long)_glfw.x11.keynames + lVar1 + -0x10) = pcVar6;
              free(pcVar5);
            }
            else {
              *(char **)((long)_glfw.x11.keynames + lVar1 + -0x10) = local_208;
            }
          }
        }
        else if (actualType == local_1f0) {
          if (local_1f0 == 0x1f) {
            pcVar5 = convertLatin1toUTF8(data);
          }
          else {
            pcVar5 = _glfw_strdup(data);
          }
          *(char **)((long)_glfw.x11.keynames + lVar1 + -0x10) = pcVar5;
        }
        XFree(data);
        pcVar5 = *(char **)((long)_glfw.x11.keynames + lVar1 + -0x10);
        if (pcVar5 != (char *)0x0) {
          return pcVar5;
        }
      }
      lVar7 = local_1d8 + 1;
    }
    pcVar5 = *(char **)((long)_glfw.x11.keynames + lVar1 + -0x10);
    if (pcVar5 == (char *)0x0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
      pcVar5 = *(char **)((long)_glfw.x11.keynames + lVar1 + -0x10);
    }
  }
  return pcVar5;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (size_t i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForX11Event(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForX11Event(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (string)
                    {
                        if (targets[i] == XA_STRING)
                        {
                            *selectionString = convertLatin1toUTF8(string);
                            free(string);
                        }
                        else
                            *selectionString = string;
                    }

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}